

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_act(parser *p)

{
  void *pvVar1;
  char *act_name;
  activation *paVar2;
  char *name;
  ego_item *e;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  act_name = parser_getstr(p,"name");
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    paVar2 = lookup_activation(act_name);
    *(activation **)((long)pvVar1 + 0x248) = paVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_act(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	const char *name = parser_getstr(p, "name");

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->activation = lookup_activation(name);
	return PARSE_ERROR_NONE;
}